

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_query.cpp
# Opt level: O0

void __thiscall
HtmlFormParser_some_sequences_Test::HtmlFormParser_some_sequences_Test
          (HtmlFormParser_some_sequences_Test *this)

{
  HtmlFormParser_some_sequences_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__HtmlFormParser_some_sequences_Test_0082a6e0;
  return;
}

Assistant:

TEST(HtmlFormParser, some_sequences) {
	std::vector<std::pair<std::u8string_view, std::u8string_view>> parsed_result;
	std::u8string query_text = u8"k+y=va+u%20&%73econd%5Fke%79=second_valu%65";
	EXPECT_TRUE(jessilib::deserialize_html_form(parsed_result, query_text));
	EXPECT_TRUE(query_text.starts_with(u8"k yva u second_keysecond_value"));
	EXPECT_EQ(parsed_result.size(), 2);
	EXPECT_EQ(parsed_result[0].first, u8"k y");
	EXPECT_EQ(parsed_result[0].second, u8"va u ");
	EXPECT_EQ(parsed_result[1].first, u8"second_key");
	EXPECT_EQ(parsed_result[1].second, u8"second_value");
}